

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

BasicMutSuffix<int> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::FindOrCreateSuffix<int>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<int> *sufdef)

{
  StringRef name;
  uint uVar1;
  uint kind;
  SuffixBase table;
  SafeBool SVar2;
  BasicProblem<mp::BasicProblemParams<int>_> *in_RSI;
  char *in_RDI;
  int suf_size;
  BasicMutSuffix<int> suf_raw;
  Kind main_kind;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffc0 [16];
  Kind kind_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff8;
  
  kind_00 = in_stack_ffffffffffffffc0._12_4_;
  uVar1 = SuffixDef<int>::kind((SuffixDef<int> *)in_RSI);
  kind = uVar1 & 3;
  table.impl_ = (Impl *)FindSuffix<int>(in_RSI,(SuffixDef<int> *)
                                               (CONCAT44(uVar1,in_stack_ffffffffffffffe0) &
                                               0x3ffffffff));
  GetSuffixSize((BasicProblem<mp::BasicProblemParams<int>_> *)
                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),kind_00);
  SVar2 = internal::SuffixBase::operator_cast_to_function_pointer
                    ((SuffixBase *)&stack0xffffffffffffffd8);
  if (SVar2 == 0) {
    SuffixManager::suffixes
              ((SuffixManager *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (Kind)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    SuffixDef<int>::name((SuffixDef<int> *)in_RSI);
    SuffixDef<int>::kind((SuffixDef<int> *)in_RSI);
    SuffixDef<int>::table_abi_cxx11_((SuffixDef<int> *)in_RSI);
    name.size_ = in_stack_fffffffffffffff8;
    name.data_ = in_RDI;
    table.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::Add<int>
                                    ((BasicSuffixSet<std::allocator<char>_> *)in_RSI,name,kind,
                                     in_stack_ffffffffffffffe0,table.impl_);
  }
  else {
    internal::SuffixBase::or_kind((SuffixBase *)&stack0xffffffffffffffd8,0x10);
  }
  return (BasicMutSuffix<int>)table.impl_;
}

Assistant:

BasicMutSuffix<T> FindOrCreateSuffix(const SuffixDef<T>& sufdef) {
    auto main_kind = (suf::Kind)(sufdef.kind() & suf::KIND_MASK);
    auto suf_raw = FindSuffix(sufdef);
    auto suf_size = GetSuffixSize(main_kind);    // can be < values.size()
    if (suf_raw) {
      suf_raw.or_kind(suf::OUTPUT);
      return suf_raw;
    }
    return suffixes(main_kind).template
            Add<T>(sufdef.name(), sufdef.kind() | suf::OUTPUT,
                   suf_size, sufdef.table());
  }